

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

_glist * glist_addglist(_glist *g,t_symbol *sym,t_float x1,t_float y1,t_float x2,t_float y2,
                       t_float px1,t_float py1,t_float px2,t_float py2)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  _glist *p_Var3;
  _binbuf *p_Var4;
  t_symbol *ptVar5;
  int local_80;
  char local_78 [4];
  t_float zz_1;
  char buf [40];
  _glist *x;
  char *str;
  int menu;
  int zz;
  t_float py2_local;
  t_float px2_local;
  t_float py1_local;
  t_float px1_local;
  t_float y2_local;
  t_float x2_local;
  t_float y1_local;
  t_float x1_local;
  t_symbol *sym_local;
  _glist *g_local;
  
  bVar1 = false;
  buf._32_8_ = pd_new(canvas_class);
  glist_init((_glist *)buf._32_8_);
  *(byte *)(buf._32_8_ + 0x2e) = *(byte *)(buf._32_8_ + 0x2e) & 0xfc | 1;
  if (*sym->s_name == '\0') {
    glist_addglist::gcount = glist_addglist::gcount + 1;
    sprintf(local_78,"graph%d");
    _y1_local = gensym(local_78);
    bVar1 = true;
  }
  else {
    __s1 = sym->s_name;
    iVar2 = strncmp(__s1,"graph",5);
    _y1_local = sym;
    if ((iVar2 == 0) && (iVar2 = atoi(__s1 + 5), glist_addglist::gcount < iVar2)) {
      glist_addglist::gcount = iVar2;
    }
  }
  menu = (int)py2;
  py2_local = py1;
  py1_local = y2;
  y2_local = y1;
  if (py2 < py1) {
    menu = (int)py1;
    py2_local = py2;
    py1_local = y1;
    y2_local = y2;
  }
  if (((x1 == x2) && (!NAN(x1) && !NAN(x2))) ||
     ((px1_local = x2, x2_local = x1, y2_local == py1_local && (!NAN(y2_local) && !NAN(py1_local))))
     ) {
    x2_local = 0.0;
    px1_local = 100.0;
    y2_local = 1.0;
    py1_local = -1.0;
  }
  if ((px2 <= px1) || (zz = (int)px2, px2_local = px1, (float)menu <= py2_local)) {
    px2_local = 100.0;
    py2_local = 20.0;
    zz = 0x43960000;
    menu = 0x43200000;
  }
  *(t_symbol **)(buf._32_8_ + 200) = _y1_local;
  *(t_float *)(buf._32_8_ + 0x58) = x2_local;
  *(t_float *)(buf._32_8_ + 0x60) = px1_local;
  *(t_float *)(buf._32_8_ + 0x5c) = y2_local;
  *(t_float *)(buf._32_8_ + 100) = py1_local;
  *(short *)(buf._32_8_ + 0x28) = (short)(int)px2_local;
  *(short *)(buf._32_8_ + 0x2a) = (short)(int)py2_local;
  *(int *)(buf._32_8_ + 0x50) = (int)((float)zz - px2_local);
  *(int *)(buf._32_8_ + 0x54) = (int)((float)menu - py2_local);
  p_Var3 = canvas_getcurrent();
  if (p_Var3 == (_glist *)0x0) {
    local_80 = sys_defaultfont;
  }
  else {
    p_Var3 = canvas_getcurrent();
    local_80 = p_Var3->gl_font;
  }
  *(int *)(buf._32_8_ + 0xd0) = local_80;
  *(int *)(buf._32_8_ + 0xec) = g->gl_zoom;
  *(undefined4 *)(buf._32_8_ + 0x68) = 0;
  *(undefined4 *)(buf._32_8_ + 0x6c) = 0x32;
  *(undefined4 *)(buf._32_8_ + 0x70) = 0x1c2;
  *(undefined4 *)(buf._32_8_ + 0x74) = 300;
  *(_glist **)(buf._32_8_ + 0x48) = g;
  canvas_bind((_glist *)buf._32_8_);
  *(ushort *)(buf._32_8_ + 0xe8) = *(ushort *)(buf._32_8_ + 0xe8) & 0xfeff | 0x100;
  *(ushort *)(buf._32_8_ + 0xe8) = *(ushort *)(buf._32_8_ + 0xe8) & 0xff7f;
  p_Var4 = binbuf_new();
  *(_binbuf **)(buf._32_8_ + 0x10) = p_Var4;
  canvas_undo_init((_glist *)buf._32_8_);
  p_Var4 = *(_binbuf **)(buf._32_8_ + 0x10);
  ptVar5 = gensym("graph");
  binbuf_addv(p_Var4,"s",ptVar5);
  if (!bVar1) {
    pd_pushsym((t_pd *)buf._32_8_);
  }
  glist_add(g,(t_gobj *)buf._32_8_);
  return (_glist *)buf._32_8_;
}

Assistant:

t_glist *glist_addglist(t_glist *g, t_symbol *sym,
    t_float x1, t_float y1, t_float x2, t_float y2,
    t_float px1, t_float py1, t_float px2, t_float py2)
{
    static int gcount = 0;  /* it's OK if two threads get the same value */
    int zz;
    int menu = 0;
    const char *str;
    t_glist *x = (t_glist *)pd_new(canvas_class);
    glist_init(x);
    x->gl_obj.te_type = T_OBJECT;
    if (!*sym->s_name)
    {
        char buf[40];
        sprintf(buf, "graph%d", ++gcount);
        sym = gensym(buf);
        menu = 1;
    }
    else if (!strncmp((str = sym->s_name), "graph", 5)
        && (zz = atoi(str + 5)) > gcount)
            gcount = zz;
        /* in 0.34 and earlier, the pixel rectangle and the y bounds were
        reversed; this would behave the same, except that the dialog window
        would be confusing.  The "correct" way is to have "py1" be the value
        that is higher on the screen. */
    if (py2 < py1)
    {
        t_float zz;
        zz = y2;
        y2 = y1;
        y1 = zz;
        zz = py2;
        py2 = py1;
        py1 = zz;
    }
    if (x1 == x2 || y1 == y2)
        x1 = 0, x2 = 100, y1 = 1, y2 = -1;
    if (px1 >= px2 || py1 >= py2)
        px1 = 100, py1 = 20, px2 = 100 + GLIST_DEFGRAPHWIDTH,
            py2 = 20 + GLIST_DEFGRAPHHEIGHT;
    x->gl_name = sym;
    x->gl_x1 = x1;
    x->gl_x2 = x2;
    x->gl_y1 = y1;
    x->gl_y2 = y2;
    x->gl_obj.te_xpix = px1;
    x->gl_obj.te_ypix = py1;
    x->gl_pixwidth = px2 - px1;
    x->gl_pixheight = py2 - py1;
    x->gl_font =  (canvas_getcurrent() ?
        canvas_getcurrent()->gl_font : sys_defaultfont);
    x->gl_zoom = g->gl_zoom;
    x->gl_screenx1 = GLIST_DEFCANVASXLOC;
    x->gl_screeny1 = GLIST_DEFCANVASYLOC;
    x->gl_screenx2 = GLIST_DEFCANVASWIDTH;
    x->gl_screeny2 = GLIST_DEFCANVASHEIGHT;
    x->gl_owner = g;
    canvas_bind(x);
    x->gl_isgraph = 1;
    x->gl_goprect = 0;
    x->gl_obj.te_binbuf = binbuf_new();
        /* initialize private data, like the undo-queue */
    canvas_undo_init(x);

    binbuf_addv(x->gl_obj.te_binbuf, "s", gensym("graph"));
    if (!menu)
        pd_pushsym(&x->gl_pd);
    glist_add(g, &x->gl_gobj);
    return (x);
}